

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void predict_inter_block(AV1_COMMON *cm,DecoderCodingBlock *dcb,BLOCK_SIZE bsize)

{
  macroblockd_plane *planes;
  uint8_t uVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  RefCntBuffer *pRVar9;
  MB_MODE_INFO *pMVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint bh;
  long lVar15;
  byte bVar16;
  uint uVar17;
  uint uVar24;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  byte bVar21;
  int iVar22;
  macroblockd_plane *pmVar23;
  long lVar25;
  MB_MODE_INFO *pMVar26;
  MB_MODE_INFO **ppMVar27;
  int iVar28;
  uint uVar29;
  int j;
  uint uVar30;
  ulong uVar31;
  uint8_t *puVar32;
  bool bVar33;
  build_prediction_ctxt local_1b0;
  int dst_stride2 [3];
  int dst_stride1 [3];
  int local_158 [4];
  int dst_height1 [3];
  int dst_width2 [3];
  int dst_width1 [3];
  uint8_t *dst_buf2 [3];
  uint8_t *dst_buf1 [3];
  undefined1 local_e0 [24];
  int local_c8;
  int local_c4;
  int local_c0;
  
  pMVar26 = *(dcb->xd).mi;
  bVar33 = cm->seq_params->monochrome == '\0';
  iVar28 = (dcb->xd).mi_row;
  iVar4 = (dcb->xd).mi_col;
  bVar16 = 1;
  lVar25 = 0;
  do {
    if ('\0' < pMVar26->ref_frame[lVar25]) {
      iVar13 = cm->remapped_ref_idx[(int)pMVar26->ref_frame[lVar25] - 1];
      pRVar9 = cm->ref_frame_map[iVar13];
      (dcb->xd).block_ref_scale_factors[lVar25] = cm->ref_scale_factors + iVar13;
      av1_setup_pre_planes
                (&dcb->xd,(int)lVar25,&pRVar9->buf,iVar28,iVar4,cm->ref_scale_factors + iVar13,
                 bVar33 + 1 + (uint)bVar33);
    }
    lVar25 = 1;
    bVar11 = (bool)(bVar16 & '\0' < pMVar26->ref_frame[1]);
    bVar16 = 0;
  } while (bVar11);
  uVar1 = cm->seq_params->monochrome;
  planes = (dcb->xd).plane;
  puVar32 = &(dcb->xd).plane[0].height;
  uVar31 = 0;
  do {
    if ((uVar31 != 0) && ((dcb->xd).is_chroma_ref != true)) break;
    dec_build_inter_predictors
              (cm,dcb,(int)uVar31,*(dcb->xd).mi,0,(uint)puVar32[-1],(uint)*puVar32,iVar4 << 2,
               iVar28 << 2);
    pMVar10 = *(dcb->xd).mi;
    if (('\0' < pMVar10->ref_frame[0]) &&
       (((pMVar10->ref_frame[1] == '\0' && (0xf8 < (byte)(pMVar10->bsize - BLOCK_32X64))) &&
        (0xfb < (byte)(pMVar10->mode - 0x11))))) {
      local_e0._0_8_ = (dcb->xd).plane[0].dst.buf;
      local_e0._8_8_ = (dcb->xd).plane[1].dst.buf;
      local_e0._16_8_ = (dcb->xd).plane[2].dst.buf;
      local_c8 = (dcb->xd).plane[0].dst.stride;
      local_c4 = (dcb->xd).plane[1].dst.stride;
      local_c0 = (dcb->xd).plane[2].dst.stride;
      av1_build_interintra_predictor
                (cm,&dcb->xd,((buf_2d *)(puVar32 + -0x99))->buf,*(int *)(puVar32 + -0x81),
                 (BUFFER_SET *)local_e0,(int)uVar31,bsize);
    }
    if (uVar1 != '\0') break;
    puVar32 = puVar32 + 0xa30;
    bVar33 = uVar31 < 2;
    uVar31 = uVar31 + 1;
  } while (bVar33);
  if (pMVar26->motion_mode == '\x01') {
    uVar1 = cm->seq_params->monochrome;
    dst_stride1[2] = 0x80;
    dst_stride1[0] = 0x80;
    dst_stride1[1] = 0x80;
    dst_stride2[2] = 0x80;
    dst_stride2[0] = 0x80;
    dst_stride2[1] = 0x80;
    dst_width1[2] = 0x80;
    dst_width1[0] = 0x80;
    dst_width1[1] = 0x80;
    dst_width2[2] = 0x80;
    dst_width2[0] = 0x80;
    dst_width2[1] = 0x80;
    dst_height1[2] = 0x80;
    dst_height1[0] = 0x80;
    dst_height1[1] = 0x80;
    local_158[2] = 0x80;
    local_158[0] = 0x80;
    local_158[1] = 0x80;
    av1_setup_obmc_dst_bufs(&dcb->xd,dst_buf1,dst_buf2);
    ppMVar27 = (dcb->xd).mi;
    if ((dcb->xd).up_available == true) {
      bVar16 = (dcb->xd).height;
      iVar28 = 0x100;
      if (bVar16 < 0x10) {
        iVar28 = (uint)bVar16 << 4;
      }
      iVar28 = (uint)bVar16 * 0x20 - iVar28;
      iVar13 = (dcb->xd).mb_to_bottom_edge + iVar28;
      (dcb->xd).mb_to_bottom_edge = iVar13;
      local_1b0.tmp_width = dst_width1;
      local_1b0.tmp_height = dst_height1;
      local_1b0.tmp_stride = dst_stride1;
      local_1b0.mb_to_far_edge = (dcb->xd).mb_to_right_edge;
      uVar30 = (dcb->xd).mi_col;
      lVar25 = (long)(int)uVar30;
      iVar22 = (dcb->xd).width + uVar30;
      iVar4 = (cm->mi_params).mi_cols;
      if (iVar4 <= iVar22) {
        iVar22 = iVar4;
      }
      local_1b0.cm = cm;
      local_1b0.tmp_buf = dst_buf1;
      local_1b0.dcb = dcb;
      if (((0x3efffcUL >> ((ulong)(*ppMVar27)->bsize & 0x3f) & 1) != 0) && ((int)uVar30 < iVar22)) {
        iVar4 = max_neighbor_obmc[""[(*ppMVar27)->bsize]];
        uVar17 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
        lVar15 = (long)(dcb->xd).mi_stride;
        iVar13 = 0;
        uVar29 = uVar30;
        do {
          bVar16 = 0x10;
          if ((0x1f07ffUL >> ((ulong)ppMVar27[((int)uVar29 - lVar15) - lVar25]->bsize & 0x3f) & 1)
              != 0) {
            bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [ppMVar27[((int)uVar29 - lVar15) - lVar25]->bsize];
          }
          lVar12 = ((int)uVar29 - lVar15) - lVar25;
          uVar24 = uVar29 & 0xfffffffe;
          uVar19 = (uint)bVar16;
          if (bVar16 == 1) {
            uVar19 = 2;
            uVar29 = uVar24;
            lVar12 = (((long)(int)uVar24 + 1) - lVar15) - lVar25;
          }
          pMVar26 = ppMVar27[lVar12];
          if (((pMVar26->field_0xa7 & 0x80) != 0) || ('\0' < pMVar26->ref_frame[0])) {
            uVar24._0_1_ = (dcb->xd).width;
            uVar24._1_1_ = (dcb->xd).height;
            uVar24._2_2_ = *(undefined2 *)&(dcb->xd).field_0x2076;
            if ((byte)uVar19 <= (byte)(undefined1)uVar24) {
              uVar24 = uVar19;
            }
            iVar5 = (dcb->xd).mi_col;
            memcpy((MB_MODE_INFO *)local_e0,pMVar26,0xb0);
            av1_setup_build_prediction_by_above_pred
                      (&dcb->xd,uVar29 - uVar30,(uint8_t)uVar24,(MB_MODE_INFO *)local_e0,&local_1b0,
                       uVar17);
            iVar6 = (dcb->xd).mi_row;
            BVar2 = (*(dcb->xd).mi)->bsize;
            bVar16 = block_size_high[BVar2];
            uVar31 = 0;
            pmVar23 = planes;
            do {
              iVar7 = pmVar23->subsampling_x;
              iVar8 = pmVar23->subsampling_y;
              iVar14 = av1_skip_u4x4_pred_in_obmc(BVar2,pmVar23,0);
              if (iVar14 == 0) {
                bVar20 = (char)iVar8 + 1;
                uVar18 = (uint)(bVar16 >> (bVar20 & 0x1f));
                bh = 0x40 >> (bVar20 & 0x1f);
                if (uVar18 < bh) {
                  bh = uVar18;
                }
                if (uVar18 < 4) {
                  bh = 4;
                }
                dec_build_inter_predictors
                          (local_1b0.cm,(DecoderCodingBlock *)local_1b0.dcb,(int)uVar31,
                           (MB_MODE_INFO *)local_e0,1,((uVar24 & 0xff) << 2) >> ((byte)iVar7 & 0x1f)
                           ,bh,(iVar5 + (uVar29 - uVar30)) * 4,iVar6 << 2);
              }
              uVar31 = uVar31 + 1;
              pmVar23 = pmVar23 + 1;
            } while (uVar17 != uVar31);
            iVar13 = iVar13 + 1;
          }
          uVar29 = uVar29 + uVar19;
        } while (((int)uVar29 < iVar22) && (iVar13 < iVar4));
        uVar30 = (dcb->xd).mi_col;
        iVar13 = (dcb->xd).mb_to_bottom_edge;
        ppMVar27 = (dcb->xd).mi;
      }
      (dcb->xd).mb_to_left_edge = uVar30 * -0x20;
      (dcb->xd).mb_to_right_edge = local_1b0.mb_to_far_edge;
      (dcb->xd).mb_to_bottom_edge = iVar13 - iVar28;
    }
    uVar30 = (dcb->xd).mi_row;
    if ((dcb->xd).left_available == true) {
      bVar16 = (dcb->xd).width;
      iVar28 = 0x100;
      if (bVar16 < 0x10) {
        iVar28 = (uint)bVar16 << 4;
      }
      iVar28 = (uint)bVar16 * 0x20 - iVar28;
      iVar13 = (dcb->xd).mb_to_right_edge + iVar28;
      (dcb->xd).mb_to_right_edge = iVar13;
      local_1b0.tmp_width = dst_width2;
      local_1b0.tmp_height = local_158;
      local_1b0.tmp_stride = dst_stride2;
      local_1b0.mb_to_far_edge = (dcb->xd).mb_to_bottom_edge;
      iVar22 = (dcb->xd).height + uVar30;
      iVar4 = (cm->mi_params).mi_rows;
      if (iVar4 <= iVar22) {
        iVar22 = iVar4;
      }
      local_1b0.cm = cm;
      local_1b0.tmp_buf = dst_buf2;
      local_1b0.dcb = dcb;
      if (((0x3dfffaUL >> ((ulong)(*ppMVar27)->bsize & 0x3f) & 1) != 0) && ((int)uVar30 < iVar22)) {
        iVar4 = max_neighbor_obmc[""[(*ppMVar27)->bsize]];
        uVar17 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
        lVar25 = (long)(dcb->xd).mi_stride * (long)(int)uVar30;
        iVar13 = 0;
        uVar29 = uVar30;
        do {
          iVar5 = (dcb->xd).mi_stride;
          pMVar26 = ppMVar27[((long)(int)(iVar5 * uVar29) + -1) - lVar25];
          uVar31 = (ulong)pMVar26->bsize;
          bVar16 = 0x10;
          uVar19 = uVar29;
          if ((0x2f0bffUL >> (uVar31 & 0x3f) & 1) != 0) {
            if ((0x20005UL >> (uVar31 & 0x3f) & 1) == 0) {
              bVar16 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [uVar31];
            }
            else {
              uVar19 = uVar29 & 0xfffffffe;
              pMVar26 = ppMVar27[((long)(int)(iVar5 * (uVar29 | 1)) + -1) - lVar25];
              bVar16 = 2;
            }
          }
          if (((pMVar26->field_0xa7 & 0x80) != 0) || ('\0' < pMVar26->ref_frame[0])) {
            bVar20 = (dcb->xd).height;
            if (bVar16 <= bVar20) {
              bVar20 = bVar16;
            }
            iVar5 = (dcb->xd).mi_row;
            memcpy((MB_MODE_INFO *)local_e0,pMVar26,0xb0);
            av1_setup_build_prediction_by_left_pred
                      (&dcb->xd,uVar19 - uVar30,bVar20,(MB_MODE_INFO *)local_e0,&local_1b0,uVar17);
            iVar6 = (dcb->xd).mi_col;
            BVar2 = (*(dcb->xd).mi)->bsize;
            bVar3 = block_size_wide[BVar2];
            uVar31 = 0;
            pmVar23 = planes;
            do {
              iVar7 = pmVar23->subsampling_x;
              iVar8 = pmVar23->subsampling_y;
              iVar14 = av1_skip_u4x4_pred_in_obmc(BVar2,pmVar23,1);
              if (iVar14 == 0) {
                bVar21 = (char)iVar7 + 1;
                uVar24 = (uint)(bVar3 >> (bVar21 & 0x1f));
                uVar29 = 0x40 >> (bVar21 & 0x1f);
                if (uVar24 < uVar29) {
                  uVar29 = uVar24;
                }
                if (uVar24 < 4) {
                  uVar29 = 4;
                }
                dec_build_inter_predictors
                          (local_1b0.cm,(DecoderCodingBlock *)local_1b0.dcb,(int)uVar31,
                           (MB_MODE_INFO *)local_e0,1,uVar29,
                           ((uint)bVar20 << 2) >> ((byte)iVar8 & 0x1f),iVar6 << 2,
                           (iVar5 + (uVar19 - uVar30)) * 4);
              }
              uVar31 = uVar31 + 1;
              pmVar23 = pmVar23 + 1;
            } while (uVar17 != uVar31);
            iVar13 = iVar13 + 1;
          }
          uVar29 = uVar19 + bVar16;
        } while (((int)uVar29 < iVar22) && (iVar13 < iVar4));
        uVar30 = (dcb->xd).mi_row;
        iVar13 = (dcb->xd).mb_to_right_edge;
        ppMVar27 = (dcb->xd).mi;
      }
      (dcb->xd).mb_to_top_edge = uVar30 * -0x20;
      (dcb->xd).mb_to_right_edge = iVar13 - iVar28;
      (dcb->xd).mb_to_bottom_edge = local_1b0.mb_to_far_edge;
    }
    bVar33 = uVar1 == '\0';
    av1_setup_dst_planes
              (planes,(*ppMVar27)->bsize,&cm->cur_frame->buf,uVar30,(dcb->xd).mi_col,0,
               bVar33 + 1 + (uint)bVar33);
    av1_build_obmc_inter_prediction(cm,&dcb->xd,dst_buf1,dst_stride1,dst_buf2,dst_stride2);
  }
  return;
}

Assistant:

static inline void predict_inter_block(AV1_COMMON *const cm,
                                       DecoderCodingBlock *dcb,
                                       BLOCK_SIZE bsize) {
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    const MV_REFERENCE_FRAME frame = mbmi->ref_frame[ref];
    if (frame < LAST_FRAME) {
      assert(is_intrabc_block(mbmi));
      assert(frame == INTRA_FRAME);
      assert(ref == 0);
    } else {
      const RefCntBuffer *ref_buf = get_ref_frame_buf(cm, frame);
      const struct scale_factors *ref_scale_factors =
          get_ref_scale_factors_const(cm, frame);

      xd->block_ref_scale_factors[ref] = ref_scale_factors;
      av1_setup_pre_planes(xd, ref, &ref_buf->buf, mi_row, mi_col,
                           ref_scale_factors, num_planes);
    }
  }

  dec_build_inter_predictor(cm, dcb, mi_row, mi_col, bsize);
  if (mbmi->motion_mode == OBMC_CAUSAL) {
    dec_build_obmc_inter_predictors_sb(cm, dcb);
  }
#if CONFIG_MISMATCH_DEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    int pixel_c, pixel_r;
    mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0, pd->subsampling_x,
                    pd->subsampling_y);
    if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                             pd->subsampling_y))
      continue;
    mismatch_check_block_pre(pd->dst.buf, pd->dst.stride,
                             cm->current_frame.order_hint, plane, pixel_c,
                             pixel_r, pd->width, pd->height,
                             xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
  }
#endif
}